

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)1>>
          (WastParser *this,Location loc,Token token,
          unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *this_00;
  LoadStoreExpr<(wabt::ExprType)1> *this_01;
  Address local_2c;
  uint32_t local_28;
  uint32_t align;
  uint32_t offset;
  Opcode opcode;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr_local;
  WastParser *this_local;
  
  _offset = out_expr;
  align = (uint32_t)Token::opcode(&token);
  ParseOffsetOpt(this,&local_28);
  ParseAlignOpt(this,&local_2c);
  this_00 = _offset;
  this_01 = (LoadStoreExpr<(wabt::ExprType)1> *)operator_new(0x48);
  LoadStoreExpr<(wabt::ExprType)1>::LoadStoreExpr(this_01,(Opcode)align,local_2c,local_28,&loc);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset(this_00,(pointer)this_01);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParsePlainLoadStoreInstr(Location loc,
                                            Token token,
                                            std::unique_ptr<Expr>* out_expr) {
  Opcode opcode = token.opcode();
  uint32_t offset;
  uint32_t align;
  ParseOffsetOpt(&offset);
  ParseAlignOpt(&align);
  out_expr->reset(new T(opcode, align, offset, loc));
  return Result::Ok;
}